

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cc
# Opt level: O0

void __thiscall
lf::mesh::hybrid2d::Triangle::Triangle
          (Triangle *this,size_type index,
          unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry
          ,Point *corner0,Point *corner1,Point *corner2,Segment *edge0,Segment *edge1,Segment *edge2
          )

{
  value_type pPVar1;
  bool bVar2;
  RefElType RVar3;
  RefElType RVar4;
  int iVar5;
  value_type vVar6;
  runtime_error *prVar7;
  pointer pGVar8;
  reference ppSVar9;
  undefined4 extraout_var;
  reference ppPVar10;
  reference ppEVar11;
  ostream *poVar12;
  undefined4 extraout_var_00;
  reference pvVar13;
  undefined1 local_1650 [8];
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> ed_nodes_1;
  undefined1 local_1638 [4];
  int ed_loc_idx_1;
  allocator<char> local_1611;
  string local_1610;
  allocator<char> local_15e9;
  string local_15e8;
  stringstream local_15c8 [8];
  stringstream ss_10;
  ostream local_15b8 [376];
  string local_1440;
  allocator<char> local_1419;
  string local_1418;
  allocator<char> local_13f1;
  string local_13f0;
  stringstream local_13d0 [8];
  stringstream ss_9;
  ostream local_13c0 [376];
  value_type local_1248;
  Point *p1_ptr;
  Point *p0_ptr;
  size_type loc_idx_p1;
  size_type loc_idx_p0;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> ed_nodes;
  allocator<char> local_11f9;
  string local_11f8;
  allocator<char> local_11d1;
  string local_11d0;
  stringstream local_11b0 [8];
  stringstream ss_8;
  ostream local_11a0 [382];
  RefEl local_1022;
  RefEl local_1021;
  value_type local_1020;
  Segment *ed_ptr;
  int ed_loc_idx;
  RefEl ref_el_tria;
  allocator<char> local_fe9;
  string local_fe8;
  allocator<char> local_fc1;
  string local_fc0;
  stringstream local_fa0 [8];
  stringstream ss_7;
  ostream local_f90 [382];
  RefEl local_e12;
  RefEl local_e11;
  string local_e10;
  allocator<char> local_de9;
  string local_de8;
  allocator<char> local_dc1;
  string local_dc0;
  stringstream local_da0 [8];
  stringstream ss_6;
  ostream local_d90 [376];
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  allocator<char> local_bc9;
  string local_bc8;
  stringstream local_ba8 [8];
  stringstream ss_5;
  ostream local_b98 [376];
  string local_a20;
  allocator<char> local_9f9;
  string local_9f8;
  allocator<char> local_9d1;
  string local_9d0;
  stringstream local_9b0 [8];
  stringstream ss_4;
  ostream local_9a0 [376];
  string local_828;
  allocator<char> local_801;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  stringstream local_7b8 [8];
  stringstream ss_3;
  ostream local_7a8 [376];
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  stringstream local_5c0 [8];
  stringstream ss_2;
  ostream local_5b0 [376];
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  stringstream local_3c8 [8];
  stringstream ss_1;
  ostream local_3b8 [376];
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [376];
  Point *local_38;
  Point *corner2_local;
  Point *corner1_local;
  Point *corner0_local;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry_local;
  Triangle *pTStack_10;
  size_type index_local;
  Triangle *this_local;
  
  local_38 = corner2;
  corner2_local = corner1;
  corner1_local = corner0;
  corner0_local = (Point *)geometry;
  geometry_local._4_4_ = index;
  pTStack_10 = this;
  Entity::Entity(&this->super_Entity);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR_Codim_0045f8f0;
  this->index_ = geometry_local._4_4_;
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::unique_ptr
            (&this->geometry_,
             (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *)
             corner0_local);
  (this->nodes_)._M_elems[0] = corner1_local;
  (this->nodes_)._M_elems[1] = corner2_local;
  (this->nodes_)._M_elems[2] = local_38;
  (this->edges_)._M_elems[0] = edge0;
  (this->edges_)._M_elems[1] = edge1;
  (this->edges_)._M_elems[2] = edge2;
  memset(&this->edge_ori_,0,0xc);
  this->this_ = &this->super_Entity;
  if (corner1_local == (Point *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1c0);
    std::operator<<(local_1b0,"Invalid pointer to corner 0");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"corner0 != nullptr",&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
               ,&local_219);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1f0,&local_218,0x1b,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (corner2_local == (Point *)0x0) {
    std::__cxx11::stringstream::stringstream(local_3c8);
    std::operator<<(local_3b8,"Invalid pointer to corner 1");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"corner1 != nullptr",&local_3e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
               ,&local_411);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_3e8,&local_410,0x1c,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_38 == (Point *)0x0) {
    std::__cxx11::stringstream::stringstream(local_5c0);
    std::operator<<(local_5b0,"Invalid pointer to corner 2");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"corner2 != nullptr",&local_5e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
               ,&local_609);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_5e0,&local_608,0x1d,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_609);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator(&local_5e1);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (edge0 != (Segment *)0x0) {
    if (edge1 == (Segment *)0x0) {
      std::__cxx11::stringstream::stringstream(local_9b0);
      std::operator<<(local_9a0,"Invalid pointer to edge 1");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9d0,"edge1 != nullptr",&local_9d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
                 ,&local_9f9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_9d0,&local_9f8,0x1f,&local_a20);
      std::__cxx11::string::~string((string *)&local_a20);
      std::__cxx11::string::~string((string *)&local_9f8);
      std::allocator<char>::~allocator(&local_9f9);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::allocator<char>::~allocator(&local_9d1);
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"this code should not be reached");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (edge2 == (Segment *)0x0) {
      std::__cxx11::stringstream::stringstream(local_ba8);
      std::operator<<(local_b98,"Invalid pointer to edge 2");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bc8,"edge2 != nullptr",&local_bc9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bf0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
                 ,&local_bf1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_bc8,&local_bf0,0x20,&local_c18);
      std::__cxx11::string::~string((string *)&local_c18);
      std::__cxx11::string::~string((string *)&local_bf0);
      std::allocator<char>::~allocator(&local_bf1);
      std::__cxx11::string::~string((string *)&local_bc8);
      std::allocator<char>::~allocator(&local_bc9);
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"this code should not be reached");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->geometry_);
    if (bVar2) {
      pGVar8 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
               ::operator->(&this->geometry_);
      iVar5 = (**pGVar8->_vptr_Geometry)();
      if (iVar5 != 2) {
        std::__cxx11::stringstream::stringstream(local_da0);
        std::operator<<(local_d90,"Geometry must describe a 2D cell");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_dc0,"geometry_->DimLocal() == 2",&local_dc1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_de8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
                   ,&local_de9);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_dc0,&local_de8,0x23,&local_e10);
        std::__cxx11::string::~string((string *)&local_e10);
        std::__cxx11::string::~string((string *)&local_de8);
        std::allocator<char>::~allocator(&local_de9);
        std::__cxx11::string::~string((string *)&local_dc0);
        std::allocator<char>::~allocator(&local_dc1);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pGVar8 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
               ::operator->(&this->geometry_);
      iVar5 = (*pGVar8->_vptr_Geometry[2])();
      local_e11.type_ = (RefElType)iVar5;
      RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_e11);
      local_e12 = lf::base::RefEl::kTria();
      RVar4 = lf::base::RefEl::operator_cast_to_RefElType(&local_e12);
      if (RVar3 != RVar4) {
        std::__cxx11::stringstream::stringstream(local_fa0);
        std::operator<<(local_f90,"Cell geometry must fit a triangle");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_fc0,"geometry_->RefEl() == base::RefEl::kTria()",&local_fc1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_fe8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
                   ,&local_fe9);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_fc0,&local_fe8,0x25,(string *)&ed_loc_idx);
        std::__cxx11::string::~string((string *)&ed_loc_idx);
        std::__cxx11::string::~string((string *)&local_fe8);
        std::allocator<char>::~allocator(&local_fe9);
        std::__cxx11::string::~string((string *)&local_fc0);
        std::allocator<char>::~allocator(&local_fc1);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    lf::base::RefEl::RefEl((RefEl *)((long)&ed_ptr + 7),kTria);
    ed_ptr._0_4_ = 0;
    while( true ) {
      if (2 < (int)(sub_idx_t)ed_ptr) {
        for (ed_nodes_1._M_extent._M_extent_value._4_4_ = 0;
            ed_nodes_1._M_extent._M_extent_value._4_4_ < 3;
            ed_nodes_1._M_extent._M_extent_value._4_4_ =
                 ed_nodes_1._M_extent._M_extent_value._4_4_ + 1) {
          ppSVar9 = std::array<const_lf::mesh::hybrid2d::Segment_*,_3UL>::operator[]
                              (&this->edges_,(long)ed_nodes_1._M_extent._M_extent_value._4_4_);
          iVar5 = (*((*ppSVar9)->super_Entity)._vptr_Entity[1])(*ppSVar9,1);
          local_1650 = (undefined1  [8])CONCAT44(extraout_var_00,iVar5);
          ppEVar11 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                               ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                local_1650,0);
          pPVar1 = (value_type)*ppEVar11;
          ppPVar10 = std::array<const_lf::mesh::hybrid2d::Point_*,_3UL>::operator[]
                               (&this->nodes_,(long)ed_nodes_1._M_extent._M_extent_value._4_4_);
          vVar6 = negative;
          if (pPVar1 == *ppPVar10) {
            vVar6 = positive;
          }
          pvVar13 = std::array<lf::mesh::Orientation,_3UL>::operator[]
                              (&this->edge_ori_,(long)ed_nodes_1._M_extent._M_extent_value._4_4_);
          *pvVar13 = vVar6;
        }
        return;
      }
      ppSVar9 = std::array<const_lf::mesh::hybrid2d::Segment_*,_3UL>::at
                          (&this->edges_,(long)(int)(sub_idx_t)ed_ptr);
      local_1020 = *ppSVar9;
      iVar5 = (*(local_1020->super_Entity)._vptr_Entity[4])();
      local_1021.type_ = (RefElType)iVar5;
      RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_1021);
      local_1022 = lf::base::RefEl::kSegment();
      RVar4 = lf::base::RefEl::operator_cast_to_RefElType(&local_1022);
      if (RVar3 != RVar4) {
        std::__cxx11::stringstream::stringstream(local_11b0);
        poVar12 = std::operator<<(local_11a0,"Wrong type for edge ");
        std::ostream::operator<<(poVar12,(sub_idx_t)ed_ptr);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11d0,"ed_ptr->RefEl() == lf::base::RefEl::kSegment()",
                   &local_11d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
                   ,&local_11f9);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_11d0,&local_11f8,0x32,(string *)&ed_nodes._M_extent);
        std::__cxx11::string::~string((string *)&ed_nodes._M_extent);
        std::__cxx11::string::~string((string *)&local_11f8);
        std::allocator<char>::~allocator(&local_11f9);
        std::__cxx11::string::~string((string *)&local_11d0);
        std::allocator<char>::~allocator(&local_11d1);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar5 = (*(local_1020->super_Entity)._vptr_Entity[1])(local_1020,1);
      _loc_idx_p1 = (pointer)CONCAT44(extraout_var,iVar5);
      p0_ptr._4_4_ = lf::base::RefEl::SubSubEntity2SubEntity
                               ((RefEl *)((long)&ed_ptr + 7),1,(sub_idx_t)ed_ptr,1,0);
      p0_ptr._0_4_ = lf::base::RefEl::SubSubEntity2SubEntity
                               ((RefEl *)((long)&ed_ptr + 7),1,(sub_idx_t)ed_ptr,1,1);
      ppPVar10 = std::array<const_lf::mesh::hybrid2d::Point_*,_3UL>::at
                           (&this->nodes_,(ulong)p0_ptr._4_4_);
      p1_ptr = *ppPVar10;
      ppPVar10 = std::array<const_lf::mesh::hybrid2d::Point_*,_3UL>::at
                           (&this->nodes_,(ulong)(sub_idx_t)p0_ptr);
      local_1248 = *ppPVar10;
      ppEVar11 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                            &loc_idx_p1,0);
      if (((Point *)*ppEVar11 != p1_ptr) &&
         (ppEVar11 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                               ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                &loc_idx_p1,0), (value_type)*ppEVar11 != local_1248)) {
        std::__cxx11::stringstream::stringstream(local_13d0);
        poVar12 = std::operator<<(local_13c0,"Node 0 of edge ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,(sub_idx_t)ed_ptr);
        std::operator<<(poVar12," not a triangle node");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_13f0,"(ed_nodes[0] == p0_ptr) || (ed_nodes[0] == p1_ptr)",
                   &local_13f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1418,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
                   ,&local_1419);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_13f0,&local_1418,0x40,&local_1440);
        std::__cxx11::string::~string((string *)&local_1440);
        std::__cxx11::string::~string((string *)&local_1418);
        std::allocator<char>::~allocator(&local_1419);
        std::__cxx11::string::~string((string *)&local_13f0);
        std::allocator<char>::~allocator(&local_13f1);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ppEVar11 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                            &loc_idx_p1,1);
      if (((Point *)*ppEVar11 != p1_ptr) &&
         (ppEVar11 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                               ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                &loc_idx_p1,1), (value_type)*ppEVar11 != local_1248)) break;
      ed_ptr._0_4_ = (sub_idx_t)ed_ptr + 1;
    }
    std::__cxx11::stringstream::stringstream(local_15c8);
    poVar12 = std::operator<<(local_15b8,"Node 1 of edge ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,(sub_idx_t)ed_ptr);
    std::operator<<(poVar12," not a triangle node");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15e8,"(ed_nodes[1] == p0_ptr) || (ed_nodes[1] == p1_ptr)",
               &local_15e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1610,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
               ,&local_1611);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_15e8,&local_1610,0x42,(string *)local_1638);
    std::__cxx11::string::~string((string *)local_1638);
    std::__cxx11::string::~string((string *)&local_1610);
    std::allocator<char>::~allocator(&local_1611);
    std::__cxx11::string::~string((string *)&local_15e8);
    std::allocator<char>::~allocator(&local_15e9);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_7b8);
  std::operator<<(local_7a8,"Invalid pointer to edge 0");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"edge0 != nullptr",&local_7d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
             ,&local_801);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_7d8,&local_800,0x1e,&local_828);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator(&local_7d9);
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"this code should not be reached");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Triangle::Triangle(size_type index,
                   std::unique_ptr<geometry::Geometry>&& geometry,
                   const Point* corner0, const Point* corner1,
                   const Point* corner2, const Segment* edge0,
                   const Segment* edge1, const Segment* edge2)
    : index_(index),
      geometry_(std::move(geometry)),
      nodes_({corner0, corner1, corner2}),
      edges_({edge0, edge1, edge2}),
      edge_ori_(),
      this_(this) {
  LF_VERIFY_MSG(corner0 != nullptr, "Invalid pointer to corner 0");
  LF_VERIFY_MSG(corner1 != nullptr, "Invalid pointer to corner 1");
  LF_VERIFY_MSG(corner2 != nullptr, "Invalid pointer to corner 2");
  LF_VERIFY_MSG(edge0 != nullptr, "Invalid pointer to edge 0");
  LF_VERIFY_MSG(edge1 != nullptr, "Invalid pointer to edge 1");
  LF_VERIFY_MSG(edge2 != nullptr, "Invalid pointer to edge 2");
  if (geometry_) {
    LF_VERIFY_MSG(geometry_->DimLocal() == 2,
                  "Geometry must describe a 2D cell");
    LF_VERIFY_MSG(geometry_->RefEl() == base::RefEl::kTria(),
                  "Cell geometry must fit a triangle");
  }

  // Consistency check: make sure that sub-entities of sub-entities
  // agree with sub-sub-entities

  const lf::base::RefEl ref_el_tria(lf::base::RefElType::kTria);
  // Run through all edges
  for (int ed_loc_idx = 0; ed_loc_idx < 3; ed_loc_idx++) {
    // Pointer to current edge
    const Segment* ed_ptr = edges_.at(ed_loc_idx);
    // Check for segement type
    LF_VERIFY_MSG(ed_ptr->RefEl() == lf::base::RefEl::kSegment(),
                  "Wrong type for edge " << ed_loc_idx);
    // Fetch nodes from current edge
    auto ed_nodes = ed_ptr->SubEntities(1);

    // Obtain local indices of endpoints of edge
    const size_type loc_idx_p0 =
        ref_el_tria.SubSubEntity2SubEntity(1, ed_loc_idx, 1, 0);
    const size_type loc_idx_p1 =
        ref_el_tria.SubSubEntity2SubEntity(1, ed_loc_idx, 1, 1);
    const Point* p0_ptr = nodes_.at(loc_idx_p0);
    const Point* p1_ptr = nodes_.at(loc_idx_p1);

    // Verify that the nodes of the triangle are nodes of the edge as well
    LF_VERIFY_MSG((ed_nodes[0] == p0_ptr) || (ed_nodes[0] == p1_ptr),
                  "Node 0 of edge " << ed_loc_idx << " not a triangle node");
    LF_VERIFY_MSG((ed_nodes[1] == p0_ptr) || (ed_nodes[1] == p1_ptr),
                  "Node 1 of edge " << ed_loc_idx << " not a triangle node");
  }

  // Finally set relative orientations for the edges. Edge i has positive
  // orientation, if its first node agrees with vertex i
  for (int ed_loc_idx = 0; ed_loc_idx < 3; ed_loc_idx++) {
    // Fetch nodes of current edge
    auto ed_nodes = edges_[ed_loc_idx]->SubEntities(1);
    edge_ori_[ed_loc_idx] = (ed_nodes[0] == nodes_[ed_loc_idx])
                                ? lf::mesh::Orientation::positive
                                : lf::mesh::Orientation::negative;
  }
}